

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::structure> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::structure>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
          (allocator_type<cs_impl::any::holder<cs::structure>,64ul,cs_impl::default_allocator_provider>
           *this,type_id *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          domain_type *args_2)

{
  long lVar1;
  holder<cs::structure> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::structure> *)operator_new(0x50);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<cs::structure> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<cs::structure>::
  holder<cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>(this_00,args,args_1,args_2);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}